

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

Result __thiscall wabt::TypeChecker::PopAndCheck1Type(TypeChecker *this,Type expected,char *desc)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  
  RVar1 = PeekAndCheckType(this,0,expected);
  RVar2.enum_._1_3_ = 0;
  RVar2.enum_._0_1_ = RVar1.enum_ == Error;
  PrintStackIfFailed<wabt::Type>(this,RVar2,desc,expected);
  RVar2 = DropTypes(this,1);
  RVar3.enum_._1_3_ = 0;
  RVar3.enum_._0_1_ = RVar1.enum_ == Error || RVar2.enum_ == Error;
  return (Result)RVar3.enum_;
}

Assistant:

Result TypeChecker::PopAndCheck1Type(Type expected, const char* desc) {
  Result result = Result::Ok;
  result |= PeekAndCheckType(0, expected);
  PrintStackIfFailed(result, desc, expected);
  result |= DropTypes(1);
  return result;
}